

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O1

int s_mp_add(mp_int *a,mp_int *b,mp_int *c)

{
  uint uVar1;
  uint uVar2;
  mp_digit *pmVar3;
  mp_digit *pmVar4;
  uint uVar5;
  int iVar6;
  mp_digit mVar7;
  ulong uVar8;
  mp_int *pmVar9;
  uint uVar10;
  mp_digit *pmVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  uint size;
  
  uVar1 = a->used;
  uVar2 = b->used;
  pmVar9 = b;
  if ((int)uVar2 < (int)uVar1) {
    pmVar9 = a;
  }
  uVar13 = uVar2;
  if ((int)uVar1 < (int)uVar2) {
    uVar13 = uVar1;
  }
  uVar5 = uVar2;
  if ((int)uVar2 < (int)uVar1) {
    uVar5 = uVar1;
  }
  size = uVar5 + 1;
  if (((int)uVar5 < c->alloc) || (iVar6 = mp_grow(c,size), iVar6 == 0)) {
    iVar6 = c->used;
    c->used = size;
    pmVar3 = c->dp;
    if ((int)uVar13 < 1) {
      mVar7 = 0;
      uVar13 = 0;
      pmVar11 = pmVar3;
    }
    else {
      pmVar11 = b->dp;
      uVar10 = uVar1;
      if ((int)uVar2 < (int)uVar1) {
        uVar10 = uVar2;
      }
      pmVar4 = a->dp;
      lVar12 = 0;
      lVar14 = 0;
      mVar7 = 0;
      do {
        uVar15 = mVar7 + pmVar4[lVar14] + pmVar11[lVar14];
        mVar7 = uVar15 >> 0x3c;
        pmVar3[lVar14] = uVar15 & 0xfffffffffffffff;
        lVar14 = lVar14 + 1;
        lVar12 = lVar12 + -8;
      } while (uVar10 != (uint)lVar14);
      pmVar11 = (mp_digit *)((long)pmVar3 - lVar12);
    }
    if ((int)uVar13 < (int)uVar5 && uVar2 != uVar1) {
      pmVar4 = pmVar9->dp;
      uVar15 = (ulong)uVar13;
      do {
        uVar8 = mVar7 + pmVar4[uVar15];
        mVar7 = uVar8 >> 0x3c;
        *pmVar11 = uVar8 & 0xfffffffffffffff;
        pmVar11 = pmVar11 + 1;
        uVar15 = uVar15 + 1;
      } while (uVar5 != uVar15);
    }
    *pmVar11 = mVar7;
    if ((int)size < iVar6) {
      memset(pmVar11 + 1,0,(ulong)((iVar6 - uVar5) - 2) * 8 + 8);
    }
    if (-1 < (int)uVar5) {
      do {
        size = uVar5 + 1;
        if (pmVar3[(ulong)size - 1] != 0) goto LAB_001048a6;
        c->used = uVar5;
        iVar6 = uVar5 + 1;
        uVar5 = uVar5 - 1;
      } while (1 < iVar6);
      size = 0;
    }
LAB_001048a6:
    iVar6 = 0;
    if (size == 0) {
      c->sign = 0;
    }
  }
  return iVar6;
}

Assistant:

int s_mp_add (mp_int * a, mp_int * b, mp_int * c)
{
  mp_int *x;
  int     olduse, res, min, max;

  /* find sizes, we let |a| <= |b| which means we have to sort
   * them.  "x" will point to the input with the most digits
   */
  if (a->used > b->used) {
    min = b->used;
    max = a->used;
    x = a;
  } else {
    min = a->used;
    max = b->used;
    x = b;
  }

  /* init result */
  if (c->alloc < max + 1) {
    if ((res = mp_grow (c, max + 1)) != MP_OKAY) {
      return res;
    }
  }

  /* get old used digit count and set new one */
  olduse = c->used;
  c->used = max + 1;

  {
    register mp_digit u, *tmpa, *tmpb, *tmpc;
    register int i;

    /* alias for digit pointers */

    /* first input */
    tmpa = a->dp;

    /* second input */
    tmpb = b->dp;

    /* destination */
    tmpc = c->dp;

    /* zero the carry */
    u = 0;
    for (i = 0; i < min; i++) {
      /* Compute the sum at one digit, T[i] = A[i] + B[i] + U */
      *tmpc = *tmpa++ + *tmpb++ + u;

      /* U = carry bit of T[i] */
      u = *tmpc >> ((mp_digit)DIGIT_BIT);

      /* take away carry bit from T[i] */
      *tmpc++ &= MP_MASK;
    }

    /* now copy higher words if any, that is in A+B 
     * if A or B has more digits add those in 
     */
    if (min != max) {
      for (; i < max; i++) {
        /* T[i] = X[i] + U */
        *tmpc = x->dp[i] + u;

        /* U = carry bit of T[i] */
        u = *tmpc >> ((mp_digit)DIGIT_BIT);

        /* take away carry bit from T[i] */
        *tmpc++ &= MP_MASK;
      }
    }

    /* add carry */
    *tmpc++ = u;

    /* clear digits above oldused */
    for (i = c->used; i < olduse; i++) {
      *tmpc++ = 0;
    }
  }

  mp_clamp (c);
  return MP_OKAY;
}